

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_blitter.cpp
# Opt level: O0

void __thiscall
QBlitterPaintEngine::drawPixmap(QBlitterPaintEngine *this,QRectF *r,QPixmap *pm,QRectF *sr)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  QBlitterPaintEnginePrivate *this_00;
  QClipData *pQVar4;
  const_iterator pQVar5;
  QRectF *in_RSI;
  CapabilitiesToStateMask *in_RDI;
  long in_FS_OFFSET;
  double awidth;
  QRect *rect;
  const_iterator __end5;
  const_iterator __begin5;
  QRegion *__range5;
  QClipData *clipData;
  bool canDrawOpacity;
  QBlitterPaintEnginePrivate *d;
  QRectF deviceRect;
  QRectF targetRect;
  QBlitterPaintEnginePrivate *in_stack_fffffffffffffee0;
  QRasterPaintEnginePrivate *in_stack_fffffffffffffee8;
  QRectF *in_stack_fffffffffffffef0;
  const_iterator local_f0;
  qreal local_a8;
  qreal local_a0;
  qreal local_98;
  QRectF *in_stack_ffffffffffffff70;
  QTransform *in_stack_ffffffffffffff78;
  QRectF *in_stack_ffffffffffffff88;
  QPixmap *in_stack_ffffffffffffff90;
  QRectF *in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  QRectF *in_stack_ffffffffffffffa8;
  QPixmap *in_stack_ffffffffffffffb0;
  QRectF *in_stack_ffffffffffffffb8;
  QRectF *in_stack_ffffffffffffffc0;
  QBlitterPaintEnginePrivate *in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QBlitterPaintEngine *)0x55d20f);
  bVar2 = CapabilitiesToStateMask::canBlitterDrawPixmapOpacity
                    ((CapabilitiesToStateMask *)in_stack_fffffffffffffee8,
                     (QPixmap *)in_stack_fffffffffffffee0);
  if ((bVar2) ||
     (bVar2 = CapabilitiesToStateMask::canBlitterDrawPixmap
                        (in_RDI,in_stack_fffffffffffffef0,(QPixmap *)in_stack_fffffffffffffee8,
                         (QRectF *)in_stack_fffffffffffffee0), bVar2)) {
    QBlitterPaintEnginePrivate::unlock((QBlitterPaintEnginePrivate *)0x55d26f);
    if (this_00->hasXForm != 0) {
      QRasterPaintEngine::state((QRasterPaintEngine *)0x55d2f7);
      QTransform::mapRect(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
    }
    pQVar4 = QRasterPaintEnginePrivate::clip(in_stack_fffffffffffffee8);
    if (pQVar4 == (QClipData *)0x0) {
      local_a8 = -NAN;
      local_a0 = -NAN;
      local_98 = -NAN;
      QPaintEngine::paintDevice((QPaintEngine *)0x55d4f7);
      iVar3 = QPaintDevice::width((QPaintDevice *)0x55d4ff);
      awidth = (double)iVar3;
      QPaintEngine::paintDevice((QPaintEngine *)0x55d513);
      iVar3 = QPaintDevice::height((QPaintDevice *)0x55d51b);
      QRectF::QRectF((QRectF *)&local_a8,0.0,0.0,awidth,(double)iVar3);
      QBlitterPaintEnginePrivate::clipAndDrawPixmap
                (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                 in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,(bool)in_stack_ffffffffffffffa7
                );
    }
    else if (((byte)pQVar4->field_0x48 >> 1 & 1) == 0) {
      if (((byte)pQVar4->field_0x48 >> 2 & 1) != 0) {
        local_f0 = QRegion::begin((QRegion *)in_stack_fffffffffffffee0);
        pQVar5 = QRegion::end((QRegion *)in_stack_fffffffffffffee0);
        for (; local_f0 != pQVar5; local_f0 = local_f0 + 1) {
          QRectF::QRectF(in_stack_fffffffffffffef0,(QRect *)this_00);
          QBlitterPaintEnginePrivate::clipAndDrawPixmap
                    (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                     in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                     (bool)in_stack_ffffffffffffffa7);
        }
      }
    }
    else {
      QRectF::QRectF((QRectF *)this_00,(QRect *)in_stack_fffffffffffffee8);
      QBlitterPaintEnginePrivate::clipAndDrawPixmap
                (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                 in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,(bool)in_stack_ffffffffffffffa7
                );
    }
  }
  else {
    QBlitterPaintEnginePrivate::lock(in_stack_fffffffffffffee0);
    QBlittablePlatformPixmap::markRasterOverlay(this_00->pmData,in_RSI);
    QRasterPaintEngine::drawPixmap
              ((QRasterPaintEngine *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
               in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QBlitterPaintEngine::drawPixmap(const QRectF &r, const QPixmap &pm, const QRectF &sr)
{
    Q_D(QBlitterPaintEngine);
    bool canDrawOpacity;

    canDrawOpacity = d->caps.canBlitterDrawPixmapOpacity(pm);
    if (canDrawOpacity || (d->caps.canBlitterDrawPixmap(r, pm, sr))) {

        d->unlock();
        QRectF targetRect = r;
        if (d->hasXForm)
            targetRect = state()->matrix.mapRect(r);
        const QClipData *clipData = d->clip();
        if (clipData) {
            if (clipData->hasRectClip) {
                d->clipAndDrawPixmap(clipData->clipRect, targetRect, pm, sr, canDrawOpacity);
            } else if (clipData->hasRegionClip) {
                for (const QRect &rect : clipData->clipRegion)
                    d->clipAndDrawPixmap(rect, targetRect, pm, sr, canDrawOpacity);
            }
        } else {
            QRectF deviceRect(0, 0, paintDevice()->width(), paintDevice()->height());
            d->clipAndDrawPixmap(deviceRect, targetRect, pm, sr, canDrawOpacity);
        }
    }else {
        d->lock();
        d->pmData->markRasterOverlay(r);
        QRasterPaintEngine::drawPixmap(r, pm, sr);
    }
}